

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O0

bool __thiscall DataRefs::ToggleLabelDraw(DataRefs *this)

{
  bool bVar1;
  DataRefs *in_RDI;
  bool local_1;
  
  bVar1 = IsVREnabled(in_RDI);
  if (bVar1) {
    local_1 = (*(byte *)&in_RDI->labelShown >> 2 & 1) == 0;
    *(byte *)&in_RDI->labelShown = *(byte *)&in_RDI->labelShown & 0xfb | local_1 << 2;
  }
  else {
    bVar1 = IsViewExternal((DataRefs *)0x13f6e4);
    if (bVar1) {
      local_1 = ((uint)in_RDI->labelShown & 1) == 0;
      *(byte *)&in_RDI->labelShown = *(byte *)&in_RDI->labelShown & 0xfe | local_1;
    }
    else {
      local_1 = (*(byte *)&in_RDI->labelShown >> 1 & 1) == 0;
      *(byte *)&in_RDI->labelShown = *(byte *)&in_RDI->labelShown & 0xfd | local_1 << 1;
    }
  }
  return local_1;
}

Assistant:

bool DataRefs::ToggleLabelDraw()
{
    // Situation = VR?
    if (IsVREnabled())
        return (labelShown.bVR = !labelShown.bVR);
    // Situation = External View?
    if (IsViewExternal())
        return (labelShown.bExternal = !labelShown.bExternal);
    // Situation = Internal View
    else
        return (labelShown.bInternal = !labelShown.bInternal);
}